

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.hpp
# Opt level: O3

float __thiscall
re::beatnik::tracker<float,_256L,_4L>::estimate_period(tracker<float,_256L,_4L> *this)

{
  ring_array<float,_1024UL> *prVar1;
  ring_array<long,_1024UL> *this_00;
  size_type sVar2;
  size_type position;
  float local_50;
  float local_4c;
  undefined1 *local_48;
  long local_40;
  ring_array<float,_1024UL> *local_38;
  long local_30;
  ring_array<float,_1024UL> *local_28;
  undefined8 local_20;
  
  this->counter = 0;
  prVar1 = &this->cumulative_score;
  local_30 = 0x400 - this->period_guess;
  local_20 = 0x400;
  local_38 = prVar1;
  local_28 = prVar1;
  ::std::
  __max_element<std::reverse_iterator<re::indexed_iterator<re::ring_array<float,1024ul>,true>>,__gnu_cxx::__ops::_Iter_less_iter>
            (&local_48);
  if (prVar1 != (ring_array<float,_1024UL> *)local_48) {
    __assert_fail("container == rhs.container",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/include/re/lib/container/indexed_iterator.hpp"
                  ,0x6a,
                  "difference_type re::indexed_iterator<re::ring_array<float, 1024>, true>::operator-(const indexed_iterator<Container, IsConst> &) const [Container = re::ring_array<float, 1024>, IsConst = true]"
                 );
  }
  position = local_40 - 1;
  this_00 = &this->backlink;
  sVar2 = ring_array<long,_1024UL>::position_to_index(this_00,position);
  if ((this->backlink).c._M_elems[sVar2] < (long)position) {
    local_50 = 0.0;
    local_4c = 0.0;
    do {
      sVar2 = ring_array<long,_1024UL>::position_to_index(this_00,position);
      if ((this->backlink).c._M_elems[sVar2] == 0) break;
      sVar2 = ring_array<long,_1024UL>::position_to_index(this_00,position);
      local_4c = local_4c + (float)(this->backlink).c._M_elems[sVar2];
      local_50 = local_50 + 1.0;
      sVar2 = ring_array<long,_1024UL>::position_to_index(this_00,position);
      position = position - (this->backlink).c._M_elems[sVar2];
      sVar2 = ring_array<long,_1024UL>::position_to_index(this_00,position);
    } while ((this->backlink).c._M_elems[sVar2] < (long)position);
    local_4c = local_4c / local_50;
  }
  else {
    local_4c = NAN;
  }
  return local_4c;
}

Assistant:

T
    estimate_period() noexcept
    {
        counter = 0;

        auto max_index = static_cast<int_t>(
            std::distance(
                std::crbegin(cumulative_score),
                std::max_element(
                    std::crbegin(cumulative_score),
                    std::crbegin(cumulative_score) + period_guess
                )
            )
        );
        auto last_beat = N - max_index - 1;

        T periods_sum = 0;
        T periods_count = 0;

        // jump in reverse from a beat to another
        while (last_beat > backlink[last_beat]) {
            if (backlink[last_beat] == 0) break; // JIC
            periods_sum += backlink[last_beat];
            periods_count++;
            last_beat -= backlink[last_beat];
        }

        return periods_sum / periods_count;
    }